

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_3,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::decrement<float,3,4>
          (Matrix<float,_3,_4> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_3,_4> *mat)

{
  int r;
  long lVar1;
  float *pfVar2;
  long lVar3;
  
  tcu::Matrix<float,_3,_4>::Matrix(__return_storage_ptr__);
  pfVar2 = (float *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 0xc) {
      *(float *)((long)pfVar2 + lVar3) = *(float *)(this + lVar3) + -1.0;
    }
    this = this + 4;
    pfVar2 = pfVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}